

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

Reference __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MakeCommonExpr
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int index)

{
  Reference RVar1;
  Impl *local_18;
  
  local_18 = (Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&(this->super_ExprFactory).exprs_,&local_18);
  RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>)operator_new__(0x40);
  *(undefined4 *)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ =
       3;
  ((BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> *)
  ((this->super_ExprFactory).exprs_.
   super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
   ._M_impl.super__Vector_impl_data._M_finish + -1))->super_ExprBase =
       (ExprBase)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  *(int *)((long)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_ +
          4) = index;
  return (Reference)RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

auto MakeCommonExpr(int index) {
    MP_ASSERT__RAISE(common_expr(index).is_known(),
                     fmt::format(
                         "Defined variable {} not provided in the input.\n"
                         "Please contact AMPL support.",
                         index));
    return ExprFactory::MakeCommonExpr(index);
  }